

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterAddToTree(SortSubtask *pTask,int nDepth,int iSeq,MergeEngine *pRoot,MergeEngine *pLeaf
                       )

{
  long lVar1;
  MergeEngine *pMerger;
  long in_RCX;
  int in_EDX;
  int iVar2;
  int in_ESI;
  long in_FS_OFFSET;
  MergeEngine *pNew;
  PmaReader *pReadr;
  int iIter;
  MergeEngine *p;
  int i;
  int nDiv;
  int rc;
  IncrMerger *pIncr;
  MergeEngine *in_stack_ffffffffffffffa0;
  MergeEngine *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 1;
  local_34 = vdbeIncrMergerNew((SortSubtask *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,(IncrMerger **)in_stack_ffffffffffffffa0);
  for (local_3c = 1; local_3c < in_ESI; local_3c = local_3c + 1) {
    local_38 = local_38 << 4;
  }
  local_48 = in_RCX;
  for (local_3c = 1; local_3c < in_ESI && local_34 == 0; local_3c = local_3c + 1) {
    iVar2 = (int)((long)((ulong)(uint)((int)((long)in_EDX / (long)local_38) >> 0x1f) << 0x20 |
                        (long)in_EDX / (long)local_38 & 0xffffffffU) % 0x10);
    pMerger = (MergeEngine *)(*(long *)(local_48 + 0x18) + (long)iVar2 * 0x50);
    if (pMerger[2].pTask == (SortSubtask *)0x0) {
      in_stack_ffffffffffffffa0 =
           vdbeMergeEngineNew((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if (in_stack_ffffffffffffffa0 == (MergeEngine *)0x0) {
        local_34 = 7;
      }
      else {
        local_34 = vdbeIncrMergerNew((SortSubtask *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                                     pMerger,(IncrMerger **)in_stack_ffffffffffffffa0);
      }
    }
    if (local_34 == 0) {
      local_48._0_4_ = (pMerger[2].pTask)->bDone;
      local_48._4_4_ = (pMerger[2].pTask)->nPMA;
      local_38 = local_38 / 0x10;
    }
  }
  if (local_34 == 0) {
    *(undefined1 **)(*(long *)(local_48 + 0x18) + (long)(in_EDX % 0x10) * 0x50 + 0x48) =
         &DAT_aaaaaaaaaaaaaaaa;
  }
  else {
    vdbeIncrFree((IncrMerger *)0x19ae87);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeSorterAddToTree(
  SortSubtask *pTask,             /* Task context */
  int nDepth,                     /* Depth of tree according to TreeDepth() */
  int iSeq,                       /* Sequence number of leaf within tree */
  MergeEngine *pRoot,             /* Root of tree */
  MergeEngine *pLeaf              /* Leaf to add to tree */
){
  int rc = SQLITE_OK;
  int nDiv = 1;
  int i;
  MergeEngine *p = pRoot;
  IncrMerger *pIncr;

  rc = vdbeIncrMergerNew(pTask, pLeaf, &pIncr);

  for(i=1; i<nDepth; i++){
    nDiv = nDiv * SORTER_MAX_MERGE_COUNT;
  }

  for(i=1; i<nDepth && rc==SQLITE_OK; i++){
    int iIter = (iSeq / nDiv) % SORTER_MAX_MERGE_COUNT;
    PmaReader *pReadr = &p->aReadr[iIter];

    if( pReadr->pIncr==0 ){
      MergeEngine *pNew = vdbeMergeEngineNew(SORTER_MAX_MERGE_COUNT);
      if( pNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        rc = vdbeIncrMergerNew(pTask, pNew, &pReadr->pIncr);
      }
    }
    if( rc==SQLITE_OK ){
      p = pReadr->pIncr->pMerger;
      nDiv = nDiv / SORTER_MAX_MERGE_COUNT;
    }
  }

  if( rc==SQLITE_OK ){
    p->aReadr[iSeq % SORTER_MAX_MERGE_COUNT].pIncr = pIncr;
  }else{
    vdbeIncrFree(pIncr);
  }
  return rc;
}